

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ParseEditorChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  int16_t iVar1;
  uint uVar2;
  int iVar3;
  Logger *this_01;
  basic_formatter *this_02;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  char local_2a [8];
  char buff [10];
  uint oldReadLimit;
  int chunkSize;
  Discreet3DSImporter *pDStack_10;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_10 = this;
  do {
    do {
      uVar2 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar2 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      buff._6_4_ = chunkSize + -6;
    } while ((int)buff._6_4_ < 1);
    this_00 = this->stream;
    iVar3 = StreamReader<false,_false>::GetCurrentPos(this_00);
    buff._2_4_ = StreamReader<false,_false>::SetReadLimit(this_00,iVar3 + buff._6_4_);
    if (oldReadLimit._2_2_ == 2) {
      iVar1 = StreamReader<false,_false>::GetI2(this->stream);
      ASSIMP_itoa10<10ul>((char (*) [10])local_2a,(int)iVar1);
      this_01 = DefaultLogger::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1e8,"3DS file format version: ",&local_1e9);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1c8,
                 &local_1e8);
      this_02 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_1c8,(char (*) [10])local_2a);
      Formatter::basic_formatter::operator_cast_to_string(&local_50,this_02);
      Logger::info(this_01,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
    else if (oldReadLimit._2_2_ == 0x3d3d) {
      ParseObjectChunk(this);
    }
    else if (oldReadLimit._2_2_ == -0x5000) {
      ParseKeyframeChunk(this);
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,buff._2_4_);
    uVar2 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  } while (uVar2 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseEditorChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_OBJMESH:

        ParseObjectChunk();
        break;

    // NOTE: In several documentations in the internet this
    // chunk appears at different locations
    case Discreet3DS::CHUNK_KEYFRAMER:

        ParseKeyframeChunk();
        break;

    case Discreet3DS::CHUNK_VERSION:
        {
        // print the version number
        char buff[10];
        ASSIMP_itoa10(buff,stream->GetI2());
        ASSIMP_LOG_INFO_F(std::string("3DS file format version: "), buff);
        }
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}